

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O0

char * old_create_multityped_action_spec
                 (CMFormatList *input_format_lists,CMFormatList out_format_list,char *function)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  char *pcVar4;
  long in_RSI;
  long in_RDI;
  CMFormatList format_list;
  int i;
  int count;
  int j;
  int struct_count;
  FMStructDescList *struct_list;
  FMStructDescList out_structs;
  FMStructDescList structs;
  char *in_stack_ffffffffffffffa8;
  uint6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffb7;
  long in_stack_ffffffffffffffb8;
  int iVar6;
  int iVar7;
  int local_38;
  int local_34;
  
  local_34 = 0;
  while (*(long *)(in_RDI + (long)local_34 * 8) != 0) {
    local_34 = local_34 + 1;
  }
  pvVar2 = INT_CMmalloc(CONCAT17(in_stack_ffffffffffffffb7,
                                 CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)));
  for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
    in_stack_ffffffffffffffb8 = *(long *)(in_RDI + (long)local_38 * 8);
    iVar7 = 0;
    while( true ) {
      in_stack_ffffffffffffffb7 = false;
      if (in_stack_ffffffffffffffb8 != 0) {
        in_stack_ffffffffffffffb7 = *(long *)(in_stack_ffffffffffffffb8 + (long)iVar7 * 0x10) != 0;
      }
      if ((bool)in_stack_ffffffffffffffb7 == false) break;
      iVar7 = iVar7 + 1;
    }
    pvVar3 = INT_CMmalloc((ulong)CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0));
    for (iVar6 = 0; iVar6 < iVar7; iVar6 = iVar6 + 1) {
      *(undefined8 *)((long)pvVar3 + (long)iVar6 * 0x20) =
           *(undefined8 *)(in_stack_ffffffffffffffb8 + (long)iVar6 * 0x10);
      *(undefined8 *)((long)pvVar3 + (long)iVar6 * 0x20 + 8) =
           *(undefined8 *)(in_stack_ffffffffffffffb8 + (long)iVar6 * 0x10 + 8);
      iVar1 = struct_size_field_list
                        ((FMFieldList)CONCAT44(iVar7,iVar6),
                         (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      *(int *)((long)pvVar3 + (long)iVar6 * 0x20 + 0x10) = iVar1;
      *(undefined8 *)((long)pvVar3 + (long)iVar6 * 0x20 + 0x18) = 0;
    }
    *(undefined8 *)((long)pvVar3 + (long)iVar7 * 0x20) = 0;
    *(undefined8 *)((long)pvVar3 + (long)iVar7 * 0x20 + 8) = 0;
    *(void **)((long)pvVar2 + (long)local_38 * 8) = pvVar3;
  }
  iVar7 = 0;
  while( true ) {
    uVar5 = false;
    if (in_RSI != 0) {
      uVar5 = *(long *)(in_RSI + (long)iVar7 * 0x10) != 0;
    }
    if ((bool)uVar5 == false) break;
    iVar7 = iVar7 + 1;
  }
  pvVar2 = INT_CMmalloc(CONCAT17(in_stack_ffffffffffffffb7,(uint7)in_stack_ffffffffffffffb0));
  for (iVar6 = 0; iVar6 < iVar7; iVar6 = iVar6 + 1) {
    *(undefined8 *)((long)pvVar2 + (long)iVar6 * 0x20) =
         *(undefined8 *)(in_RSI + (long)iVar6 * 0x10);
    *(undefined8 *)((long)pvVar2 + (long)iVar6 * 0x20 + 8) =
         *(undefined8 *)(in_RSI + (long)iVar6 * 0x10 + 8);
    iVar1 = struct_size_field_list
                      ((FMFieldList)CONCAT44(iVar7,iVar6),
                       (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    *(int *)((long)pvVar2 + (long)iVar6 * 0x20 + 0x10) = iVar1;
    *(undefined8 *)((long)pvVar2 + (long)iVar6 * 0x20 + 0x18) = 0;
  }
  *(undefined8 *)((long)pvVar2 + (long)iVar7 * 0x20) = 0;
  *(undefined8 *)((long)pvVar2 + (long)iVar7 * 0x20 + 8) = 0;
  pcVar4 = create_multityped_action_spec
                     ((FMStructDescList *)
                      CONCAT17(in_stack_ffffffffffffffb7,CONCAT16(uVar5,in_stack_ffffffffffffffb0)),
                      in_stack_ffffffffffffffa8);
  return pcVar4;
}

Assistant:

extern char*
old_create_multityped_action_spec(CMFormatList *input_format_lists, CMFormatList out_format_list, char *function)
{
    FMStructDescList structs, out_structs, *struct_list;
    int struct_count = 0, j;
    int count, i;
    while (input_format_lists[struct_count] != NULL) struct_count++;
    struct_list = malloc(sizeof(struct_list[0]) * (struct_count+1));
    for (j = 0; j < struct_count ; j++) {
	CMFormatList format_list = input_format_lists[j];
	count = 0;
	while (format_list && (format_list[count].format_name != NULL)) count++;
	structs = malloc(sizeof(structs[0]) * (count + 1));
	for (i = 0; i < count; i++) {
	    structs[i].format_name = format_list[i].format_name;
	    structs[i].field_list = format_list[i].field_list;
	    structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	    structs[i].opt_info = NULL;
	}
	structs[count].format_name = NULL;
	structs[count].field_list = NULL;
	struct_list[j] = structs;
    }

    count = 0;
    while (out_format_list && (out_format_list[count].format_name != NULL)) count++;
    out_structs = malloc(sizeof(out_structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	out_structs[i].format_name = out_format_list[i].format_name;
	out_structs[i].field_list = out_format_list[i].field_list;
	out_structs[i].struct_size = struct_size_field_list(out_structs[i].field_list, (int)sizeof(char*));
	out_structs[i].opt_info = NULL;
    }
    out_structs[count].format_name = NULL;
    out_structs[count].field_list = NULL;
    return create_multityped_action_spec(struct_list, function);
}